

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

double * __thiscall ON_PlaneEquation::operator[](ON_PlaneEquation *this,int i)

{
  double *invalid_coefficient;
  int i_local;
  ON_PlaneEquation *this_local;
  
  switch(i) {
  case 0:
    this_local = this;
    break;
  case 1:
    this_local = (ON_PlaneEquation *)&this->y;
    break;
  case 2:
    this_local = (ON_PlaneEquation *)&this->z;
    break;
  case 3:
    this_local = (ON_PlaneEquation *)&this->d;
    break;
  default:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_point.cpp"
               ,0x1b49,"","Invalid coefficient index.");
    this_local = (ON_PlaneEquation *)onmalloc_forever(8);
    this_local->x = ON_DBL_QNAN;
  }
  return &this_local->x;
}

Assistant:

double& ON_PlaneEquation::operator[](int i)
{
  switch (i)
  {
  case 0:
    return x;
    break;
  case 1:
    return y;
    break;
  case 2:
    return z;
    break;
  case 3:
    return d;
    break;
  }

  ON_ERROR("Invalid coefficient index.");

  // send caller something that can be dereferenced without crashing.
  double* invalid_coefficient = (double*)onmalloc_forever(sizeof(*invalid_coefficient));
  *invalid_coefficient = ON_DBL_QNAN;
  return *invalid_coefficient;
}